

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall METADemuxer::~METADemuxer(METADemuxer *this)

{
  FileListIterator *this_00;
  bool bVar1;
  reference ppFVar2;
  FileListIterator **m_iterator;
  iterator __end1;
  iterator __begin1;
  vector<FileListIterator_*,_std::allocator<FileListIterator_*>_> *__range1;
  METADemuxer *this_local;
  
  readClose(this);
  __end1 = std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::begin
                     (&this->m_iterators);
  m_iterator = (FileListIterator **)
               std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::end
                         (&this->m_iterators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FileListIterator_**,_std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>_>
                                *)&m_iterator);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<FileListIterator_**,_std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppFVar2;
    if (this_00 != (FileListIterator *)0x0) {
      FileListIterator::~FileListIterator(this_00);
      operator_delete(this_00,0x28);
    }
    __gnu_cxx::
    __normal_iterator<FileListIterator_**,_std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>_>
    ::operator++(&__end1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->m_processedTracks);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
  ::~map(&this->m_mplsStreamMap);
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::~vector(&this->m_codecInfo);
  std::__cxx11::string::~string((string *)&this->m_streamName);
  ContainerToReaderWrapper::~ContainerToReaderWrapper(&this->m_containerReader);
  std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::~vector(&this->m_iterators);
  AbstractDemuxer::~AbstractDemuxer(&this->super_AbstractDemuxer);
  return;
}

Assistant:

METADemuxer::~METADemuxer()
{
    readClose();
    for (FileListIterator*& m_iterator : m_iterators) delete m_iterator;
}